

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int xmlXPathCompOpEvalFilterFirst
              (xmlXPathParserContextPtr ctxt,xmlXPathStepOpPtr op,xmlNodePtr *first)

{
  xmlXPathCompExprPtr pxVar1;
  xmlXPathStepOp *pxVar2;
  xmlXPathObjectPtr pxVar3;
  xmlNodeSetPtr pxVar4;
  bool bVar5;
  int iVar6;
  xmlNodePtr in_RAX;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  xmlNodePtr last;
  xmlNodePtr local_38;
  
  iVar10 = 0;
  iVar9 = 0;
  iVar6 = 0;
  if (ctxt->error == 0) {
    pxVar1 = ctxt->comp;
    iVar6 = 0;
    iVar8 = 0;
    local_38 = in_RAX;
    if (((((long)op->ch1 != -1) && (lVar7 = (long)op->ch2, iVar8 = iVar6, lVar7 != -1)) &&
        (pxVar2 = pxVar1->steps, pxVar2[op->ch1].op == XPATH_OP_SORT)) &&
       (pxVar2[lVar7].op == XPATH_OP_SORT)) {
      lVar7 = (long)pxVar2[lVar7].ch1;
      iVar6 = 0;
      bVar5 = true;
      iVar8 = 0;
      if (((lVar7 != -1) && (iVar8 = iVar6, pxVar2[lVar7].op == XPATH_OP_FUNCTION)) &&
         ((pxVar2[lVar7].value5 == (void *)0x0 &&
          ((iVar10 = iVar9, pxVar2[lVar7].value == 0 &&
           ((xmlChar *)pxVar2[lVar7].value4 != (xmlChar *)0x0)))))) {
        iVar6 = xmlStrEqual((xmlChar *)pxVar2[lVar7].value4,(xmlChar *)"last");
        if (iVar6 == 0) {
          bVar5 = true;
        }
        else {
          local_38 = (xmlNodePtr)0x0;
          iVar8 = xmlXPathCompOpEvalLast(ctxt,pxVar1->steps + op->ch1,&local_38);
          iVar10 = 0;
          if ((((ctxt->error == 0) &&
               (pxVar3 = ctxt->value, iVar10 = iVar8, pxVar3 != (xmlXPathObjectPtr)0x0)) &&
              (pxVar3->type == XPATH_NODESET)) &&
             (((pxVar4 = pxVar3->nodesetval, pxVar4 != (xmlNodeSetPtr)0x0 &&
               (pxVar4->nodeTab != (xmlNodePtr *)0x0)) && (1 < pxVar4->nodeNr)))) {
            xmlXPathNodeSetKeepLast(pxVar4);
            *first = *ctxt->value->nodesetval->nodeTab;
          }
          bVar5 = false;
        }
      }
      if (!bVar5) {
        return iVar10;
      }
    }
    if ((long)op->ch1 != -1) {
      iVar6 = xmlXPathCompOpEval(ctxt,pxVar1->steps + op->ch1);
      iVar8 = iVar8 + iVar6;
    }
    iVar6 = 0;
    if (((ctxt->error == 0) && (iVar6 = iVar8, op->ch2 != -1)) &&
       (pxVar3 = ctxt->value, pxVar3 != (xmlXPathObjectPtr)0x0)) {
      if (pxVar3->type == XPATH_NODESET) {
        pxVar4 = pxVar3->nodesetval;
        if ((pxVar4 != (xmlNodeSetPtr)0x0) &&
           (xmlXPathNodeSetFilter(ctxt,pxVar4,op->ch2,1,1,1), 0 < pxVar4->nodeNr)) {
          *first = *pxVar4->nodeTab;
        }
      }
      else {
        xmlXPathErr(ctxt,0xb);
        iVar6 = 0;
      }
    }
  }
  return iVar6;
}

Assistant:

static int
xmlXPathCompOpEvalFilterFirst(xmlXPathParserContextPtr ctxt,
			      xmlXPathStepOpPtr op, xmlNodePtr * first)
{
    int total = 0;
    xmlXPathCompExprPtr comp;
    xmlNodeSetPtr set;

    CHECK_ERROR0;
    comp = ctxt->comp;
    /*
    * Optimization for ()[last()] selection i.e. the last elem
    */
    if ((op->ch1 != -1) && (op->ch2 != -1) &&
	(comp->steps[op->ch1].op == XPATH_OP_SORT) &&
	(comp->steps[op->ch2].op == XPATH_OP_SORT)) {
	int f = comp->steps[op->ch2].ch1;

	if ((f != -1) &&
	    (comp->steps[f].op == XPATH_OP_FUNCTION) &&
	    (comp->steps[f].value5 == NULL) &&
	    (comp->steps[f].value == 0) &&
	    (comp->steps[f].value4 != NULL) &&
	    (xmlStrEqual
	    (comp->steps[f].value4, BAD_CAST "last"))) {
	    xmlNodePtr last = NULL;

	    total +=
		xmlXPathCompOpEvalLast(ctxt,
		    &comp->steps[op->ch1],
		    &last);
	    CHECK_ERROR0;
	    /*
	    * The nodeset should be in document order,
	    * Keep only the last value
	    */
	    if ((ctxt->value != NULL) &&
		(ctxt->value->type == XPATH_NODESET) &&
		(ctxt->value->nodesetval != NULL) &&
		(ctxt->value->nodesetval->nodeTab != NULL) &&
		(ctxt->value->nodesetval->nodeNr > 1)) {
                xmlXPathNodeSetKeepLast(ctxt->value->nodesetval);
		*first = *(ctxt->value->nodesetval->nodeTab);
	    }
	    return (total);
	}
    }

    if (op->ch1 != -1)
	total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
    CHECK_ERROR0;
    if (op->ch2 == -1)
	return (total);
    if (ctxt->value == NULL)
	return (total);

#ifdef LIBXML_XPTR_LOCS_ENABLED
    /*
    * Hum are we filtering the result of an XPointer expression
    */
    if (ctxt->value->type == XPATH_LOCATIONSET) {
        xmlLocationSetPtr locset = ctxt->value->user;

        if (locset != NULL) {
            xmlXPathLocationSetFilter(ctxt, locset, op->ch2, 1, 1);
            if (locset->locNr > 0)
                *first = (xmlNodePtr) locset->locTab[0]->user;
        }

	return (total);
    }
#endif /* LIBXML_XPTR_LOCS_ENABLED */

    CHECK_TYPE0(XPATH_NODESET);
    set = ctxt->value->nodesetval;
    if (set != NULL) {
        xmlXPathNodeSetFilter(ctxt, set, op->ch2, 1, 1, 1);
        if (set->nodeNr > 0)
            *first = set->nodeTab[0];
    }

    return (total);
}